

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_skip(gz_statep state,long len)

{
  int iVar1;
  uint local_28;
  long lStack_20;
  uint n;
  long len_local;
  gz_statep state_local;
  
  lStack_20 = len;
  while( true ) {
    while( true ) {
      if (lStack_20 == 0) {
        return 0;
      }
      if ((state->x).have == 0) break;
      if (lStack_20 < (long)(ulong)(state->x).have) {
        local_28 = (uint)lStack_20;
      }
      else {
        local_28 = (state->x).have;
      }
      (state->x).have = (state->x).have - local_28;
      (state->x).next = (state->x).next + local_28;
      (state->x).pos = (ulong)local_28 + (state->x).pos;
      lStack_20 = lStack_20 - (ulong)local_28;
    }
    if ((state->eof != 0) && ((state->strm).avail_in == 0)) break;
    iVar1 = gz_fetch(state);
    if (iVar1 == -1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

local int gz_skip(gz_statep state, z_off64_t len) {
    unsigned n;

    /* skip over len bytes or reach end-of-file, whichever comes first */
    while (len)
        /* skip over whatever is in output buffer */
        if (state->x.have) {
            n = GT_OFF(state->x.have) || (z_off64_t)state->x.have > len ?
                (unsigned)len : state->x.have;
            state->x.have -= n;
            state->x.next += n;
            state->x.pos += n;
            len -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0)
            break;

        /* need more data to skip -- load up output buffer */
        else {
            /* get more output, looking for header if required */
            if (gz_fetch(state) == -1)
                return -1;
        }
    return 0;
}